

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O1

bool ConvertToInt(char *str,int defaultrad,size_t len,int *Result)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  if (len == 0) {
    len = strlen(str);
  }
  cVar1 = *str;
  if (cVar1 == '$') {
    str = str + 1;
LAB_0013b203:
    len = len - 1;
LAB_0013b206:
    uVar8 = 0xe;
LAB_0013b20c:
    bVar3 = false;
    switch(uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) {
    case 0:
      if (len == 0) {
LAB_0013b2c7:
        iVar4 = 0;
      }
      else {
        sVar5 = 0;
        iVar4 = 0;
        do {
          if ((str[sVar5] & 0xfeU) != 0x30) goto LAB_0013b3d8;
          iVar4 = (uint)(str[sVar5] == 0x31) + iVar4 * 2;
          sVar5 = sVar5 + 1;
        } while (len != sVar5);
      }
      break;
    default:
      goto switchD_0013b229_caseD_1;
    case 3:
      if (len == 0) goto LAB_0013b2c7;
      sVar5 = 0;
      iVar4 = 0;
      do {
        if ((byte)(str[sVar5] - 0x38U) < 0xf8) goto LAB_0013b3d8;
        iVar4 = (uint)(byte)(str[sVar5] - 0x30) + iVar4 * 8;
        sVar5 = sVar5 + 1;
      } while (len != sVar5);
      break;
    case 4:
      if (len == 0) goto LAB_0013b2c7;
      sVar5 = 0;
      iVar4 = 0;
      do {
        if ((byte)(str[sVar5] - 0x3aU) < 0xf6) goto LAB_0013b3d8;
        iVar4 = (uint)(byte)(str[sVar5] - 0x30) + iVar4 * 10;
        sVar5 = sVar5 + 1;
      } while (len != sVar5);
      break;
    case 7:
      sVar5 = 0;
      iVar4 = 0;
      do {
        if (len == sVar5) goto LAB_0013b2ca;
        bVar2 = str[sVar5];
        if ((byte)(bVar2 - 0x3a) < 0xf6) {
          if (0x25 < bVar2 - 0x41) {
            return false;
          }
          if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
            return false;
          }
        }
        iVar6 = (int)(char)bVar2;
        uVar7 = (ulong)(bVar2 - 0x30);
        if (bVar2 - 0x30 < 0x37) {
          if ((0x3ffUL >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x7e0000UL >> (uVar7 & 0x3f) & 1) == 0) {
              if ((0x7e000000000000U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_0013b370;
              iVar6 = iVar6 + -0x57;
            }
            else {
              iVar6 = iVar6 + -0x37;
            }
          }
          else {
            iVar6 = iVar6 + -0x30;
          }
        }
        else {
LAB_0013b370:
          printf("Error: %c is no hex character\n");
          iVar6 = -1;
        }
        iVar4 = iVar4 * 0x10 + iVar6;
        sVar5 = sVar5 + 1;
      } while (-1 < iVar6);
      goto LAB_0013b3d8;
    }
LAB_0013b2ca:
    *Result = iVar4;
    bVar3 = true;
  }
  else {
    if (cVar1 == '0') {
      if ((byte)(str[1] | 0x20U) == 0x78) {
        str = str + 2;
        len = len - 2;
        goto LAB_0013b206;
      }
      if (str[1] != 'o') goto LAB_0013b3ae;
      str = str + 2;
      len = len - 2;
LAB_0013b3ec:
      uVar8 = 6;
      goto LAB_0013b20c;
    }
LAB_0013b3ae:
    if ((byte)(cVar1 - 0x30U) < 10) {
      cVar1 = str[len - 1];
      if (cVar1 == 'o') {
        len = len - 1;
        goto LAB_0013b3ec;
      }
      if (cVar1 == 'h') goto LAB_0013b203;
      if (cVar1 == 'b') {
        len = len - 1;
        uVar8 = 0;
      }
      else {
        uVar8 = defaultrad - 2;
      }
      goto LAB_0013b20c;
    }
LAB_0013b3d8:
    bVar3 = false;
  }
switchD_0013b229_caseD_1:
  return bVar3;
}

Assistant:

bool ConvertToInt(char* str, int defaultrad, size_t len, int& Result)
{
	int val = 0;
	int r = 0;
	if (len == 0) len = strlen(str);

	if (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))
	{
		r = 16;
		str+=2;
		len-=2;
	} else if (str[0] == '$')
	{
		r = 16;
		str++;
		len--;
	} else if (str[0] == '0' && str[1] == 'o')
	{
		r = 8;
		str+=2;
		len-=2;
	} else {
		if (!(str[0] >= '0' && str[0] <= '9')) return false;

		if (str[len-1] == 'b')
		{
			r = 2;
			len--;
		} else if (str[len-1] == 'o')
		{
			r = 8;
			len--;
		} else if (str[len-1] == 'h')
		{
			r = 16;
			len--;
		} else {
			r = defaultrad;
		}
	}

	switch (r)
	{
	case 2: // bin
		while (len--)
		{
			if (*str != '0' && *str != '1') return false;
			val = val << 1;
			if (*str++ == '1')
			{
				val++;
			}
		}
		break;
	case 8: // oct
		while (len--)
		{
			if (*str < '0' || *str > '7') return false;
			val = val << 3;
			val+=(*str++-'0');
		}
		break;
	case 10: // dec
		while (len--)
		{
			if (*str < '0' || *str > '9') return false;
			val = val * 10;
			val += (*str++ - '0');
		}
		break;
	case 16: // hex
		while (len--)
		{
			if ((*str < '0' || *str > '9') && (*str < 'A' || *str > 'F') && (*str < 'a' || *str > 'f')) return false;
			int l = htd(*str++);
			if (l >= 0)
			{
				val = val << 4;
				val += l;
			} else {
				return false;
			}
		}
		break;
	default:
		return false;
	}
	Result = val;
	return true;
}